

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O1

void * pem_read_RSA_PUBKEY_d2i(void **x,uchar **inp,long len)

{
  EVP_PKEY *pkey;
  rsa_st *prVar1;
  CBS CStack_30;
  
  if (len < 0) {
    prVar1 = (rsa_st *)0x0;
  }
  else {
    CStack_30.data = *inp;
    CStack_30.len = len;
    pkey = (EVP_PKEY *)EVP_parse_public_key(&CStack_30);
    if (pkey == (EVP_PKEY *)0x0) {
      prVar1 = (rsa_st *)0x0;
    }
    else {
      prVar1 = EVP_PKEY_get1_RSA(pkey);
      if (prVar1 == (rsa_st *)0x0) {
        prVar1 = (rsa_st *)0x0;
      }
      else {
        if (x != (void **)0x0) {
          RSA_free((RSA *)*x);
          *x = prVar1;
        }
        *inp = CStack_30.data;
      }
    }
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
  }
  return prVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}